

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_transform.c
# Opt level: O2

void gdImageFlipVertical(gdImagePtr im)

{
  byte bVar1;
  int iVar2;
  int **ppiVar3;
  int *piVar4;
  int *piVar5;
  long lVar6;
  long lVar7;
  
  if (im->trueColor == 0) {
    for (lVar6 = 0; lVar6 < im->sy / 2; lVar6 = lVar6 + 1) {
      for (lVar7 = 0; lVar7 < im->sx; lVar7 = lVar7 + 1) {
        ppiVar3 = im->tpixels;
        bVar1 = *(byte *)(ppiVar3[lVar6] + lVar7);
        ppiVar3[lVar6][lVar7] = ppiVar3[(int)(im->sy + ~(uint)lVar6)][lVar7];
        ppiVar3[(int)(im->sy + ~(uint)lVar6)][lVar7] = (uint)bVar1;
      }
    }
  }
  else {
    for (lVar6 = 0; lVar6 < im->sy / 2; lVar6 = lVar6 + 1) {
      ppiVar3 = im->tpixels;
      piVar4 = ppiVar3[lVar6];
      piVar5 = ppiVar3[(int)(im->sy + ~(uint)lVar6)];
      for (lVar7 = 0; lVar7 < im->sx; lVar7 = lVar7 + 1) {
        iVar2 = piVar4[lVar7];
        piVar4[lVar7] = ppiVar3[(int)(im->sy + ~(uint)lVar6)][lVar7];
        piVar5[lVar7] = iVar2;
      }
    }
  }
  return;
}

Assistant:

BGD_DECLARE(void) gdImageFlipVertical(gdImagePtr im)
{
	register int x, y;

	if (im->trueColor) {
		for (y = 0; y < im->sy / 2; y++) {
			int *row_dst = im->tpixels[y];
			int *row_src = im->tpixels[im->sy - 1 - y];
			for (x = 0; x < im->sx; x++) {
				register int p;
				p = row_dst[x];
				row_dst[x] = im->tpixels[im->sy - 1 - y][x];
				row_src[x] = p;
			}
		}
	} else {
		unsigned char p;
		for (y = 0; y < im->sy / 2; y++) {
			for (x = 0; x < im->sx; x++) {
				p = im->tpixels[y][x];
				im->tpixels[y][x] =	im->tpixels[im->sy - 1 - y][x];
				im->tpixels[im->sy - 1 - y][x] = p;
			}
		}
	}
	return;
}